

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

void csscal(int n,float sa,complex<float> *cx,int incx)

{
  ulong uVar1;
  bool bVar2;
  
  if (0 < incx && 0 < n) {
    if (incx == 1) {
      for (uVar1 = 0; (uint)n != uVar1; uVar1 = uVar1 + 1) {
        cx[uVar1]._M_value =
             CONCAT44((float)(cx[uVar1]._M_value >> 0x20) * sa,(float)cx[uVar1]._M_value * sa);
      }
    }
    else {
      uVar1 = (ulong)(uint)n;
      while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
        cx->_M_value = CONCAT44((float)(cx->_M_value >> 0x20) * sa,(float)cx->_M_value * sa);
        cx = cx + (uint)incx;
      }
    }
  }
  return;
}

Assistant:

void csscal ( int n, float sa, complex <float> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    CSSCAL scales a vector by a real constant.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float SA, the multiplier.
//
//    Input/output, complex <float> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of
//    the vector CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = sa * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = sa * cx[i*incx];
    }
  }
  return;
}